

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O1

size_t hpa_alloc_batch(tsdn_t *tsdn,pai_t *self,size_t size,size_t nallocs,
                      edata_list_active_t *results,_Bool frequent_reuse,
                      _Bool *deferred_work_generated)

{
  void **ppvVar1;
  fb_group_t fVar2;
  uint64_t uVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  hpdata_t *hpdata;
  void *pvVar8;
  mutex_prof_data_t *data;
  hpdata_t *phVar9;
  _Bool oom;
  _Bool local_61;
  hpdata_t *local_60;
  size_t local_58;
  _Bool local_49;
  pthread_mutex_t *local_48;
  edata_list_active_t *local_40;
  pthread_mutex_t *local_38;
  
  if ((0x200000 < size || !frequent_reuse) && (self[100].shrink < size)) {
    return 0;
  }
  local_61 = false;
  local_40 = results;
  sVar6 = hpa_try_alloc_batch_no_grow
                    (tsdn,(hpa_shard_t *)self,size,&local_61,nallocs,results,deferred_work_generated
                    );
  if (nallocs - sVar6 == 0) {
    return sVar6;
  }
  if (local_61 != false) {
    return sVar6;
  }
  local_38 = (pthread_mutex_t *)&self[4].shrink;
  iVar5 = pthread_mutex_trylock(local_38);
  if (iVar5 != 0) {
    duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)&self[3].alloc_batch);
    *(undefined1 *)&self[4].expand = 1;
  }
  self[4].alloc_batch = self[4].alloc_batch + 1;
  if ((tsdn_t *)self[4].alloc != tsdn) {
    self[4].alloc =
         (_func_edata_t_ptr_tsdn_t_ptr_pai_t_ptr_size_t_size_t__Bool__Bool__Bool__Bool_ptr *)tsdn;
    self[3].time_until_deferred_work = self[3].time_until_deferred_work + 1;
  }
  sVar7 = hpa_try_alloc_batch_no_grow
                    (tsdn,(hpa_shard_t *)self,size,&local_61,nallocs - sVar6,local_40,
                     deferred_work_generated);
  sVar7 = sVar7 + sVar6;
  sVar6 = nallocs - sVar7;
  if ((sVar6 == 0) || (local_61 != false)) goto LAB_0119893e;
  phVar9 = (hpdata_t *)self[1].alloc;
  local_48 = (pthread_mutex_t *)&(phVar9->ql_link_purge).qre_prev;
  iVar5 = pthread_mutex_trylock(local_48);
  if (iVar5 != 0) {
    duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)phVar9);
    *(undefined1 *)&(phVar9->ql_link_purge).qre_next = 1;
  }
  ppvVar1 = &(phVar9->field_13).age_link.link.lchild;
  *ppvVar1 = (void *)((long)*ppvVar1 + 1);
  if ((tsdn_t *)(phVar9->field_13).age_link.link.next != tsdn) {
    (phVar9->field_13).ql_link_empty.qre_prev = (hpdata_t *)tsdn;
    (phVar9->field_13).age_link.link.prev =
         (void *)((long)&((phVar9->field_13).ql_link_empty.qre_next)->h_address + 1);
  }
  local_61 = false;
  local_58 = sVar7;
  if (phVar9->active_pages[0] == 0) {
    local_49 = true;
    pvVar8 = duckdb_je_pages_map((void *)0x0,0x10000000,0x200000,&local_49);
    if (pvVar8 == (void *)0x0) {
      *(undefined1 *)&(phVar9->ql_link_purge).qre_next = 0;
LAB_01198852:
      local_61 = true;
      pthread_mutex_unlock(local_48);
      bVar4 = false;
      hpdata = (hpdata_t *)0x0;
    }
    else {
      local_60 = phVar9;
      hpdata = (hpdata_t *)duckdb_je_base_alloc(tsdn,(base_t *)phVar9->active_pages[2],0xf8,0x40);
      if (hpdata == (hpdata_t *)0x0) {
        duckdb_je_pages_unmap(pvVar8,0x10000000);
        *(undefined1 *)&(local_60->ql_link_purge).qre_next = 0;
        goto LAB_01198852;
      }
      local_60->active_pages[0] = (fb_group_t)pvVar8;
      local_60->active_pages[1] = 0x10000000;
      bVar4 = true;
    }
    if (bVar4) {
LAB_0119886d:
      sVar7 = local_58;
      pvVar8 = (void *)phVar9->active_pages[0];
      uVar3 = phVar9->active_pages[3];
      phVar9->active_pages[3] = uVar3 + 1;
      local_60 = hpdata;
      duckdb_je_hpdata_init(hpdata,pvVar8,uVar3);
      phVar9->active_pages[0] = phVar9->active_pages[0] + 0x200000;
      phVar9->active_pages[1] = phVar9->active_pages[1] - 0x200000;
      goto LAB_011988a0;
    }
    phVar9 = (hpdata_t *)0x0;
    sVar7 = local_58;
  }
  else {
    fVar2 = phVar9->active_pages[1];
    hpdata = (hpdata_t *)duckdb_je_base_alloc(tsdn,(base_t *)phVar9->active_pages[2],0xf8,0x40);
    sVar7 = local_58;
    if (fVar2 == 0x200000) {
      if (hpdata == (hpdata_t *)0x0) {
        local_61 = true;
        local_60 = (hpdata_t *)0x0;
      }
      else {
        pvVar8 = (void *)phVar9->active_pages[0];
        uVar3 = phVar9->active_pages[3];
        phVar9->active_pages[3] = uVar3 + 1;
        local_60 = hpdata;
        duckdb_je_hpdata_init(hpdata,pvVar8,uVar3);
        phVar9->active_pages[0] = 0;
        phVar9->active_pages[1] = 0;
        sVar7 = local_58;
      }
    }
    else {
      if (hpdata != (hpdata_t *)0x0) goto LAB_0119886d;
      local_61 = true;
      local_60 = (hpdata_t *)0x0;
    }
LAB_011988a0:
    *(undefined1 *)&(phVar9->ql_link_purge).qre_next = 0;
    pthread_mutex_unlock(local_48);
    phVar9 = local_60;
  }
  if (phVar9 != (hpdata_t *)0x0) {
    iVar5 = pthread_mutex_trylock((pthread_mutex_t *)&self[2].shrink);
    if (iVar5 != 0) {
      duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)&self[1].alloc_batch);
      *(undefined1 *)&self[2].expand = 1;
    }
    self[2].alloc_batch = self[2].alloc_batch + 1;
    if ((tsdn_t *)self[2].alloc != tsdn) {
      self[2].alloc =
           (_func_edata_t_ptr_tsdn_t_ptr_pai_t_ptr_size_t_size_t__Bool__Bool__Bool__Bool_ptr *)tsdn;
      self[1].time_until_deferred_work = self[1].time_until_deferred_work + 1;
    }
    duckdb_je_psset_insert((psset_t *)&self[5].dalloc_batch,phVar9);
    *(undefined1 *)&self[2].expand = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&self[2].shrink);
    sVar7 = hpa_try_alloc_batch_no_grow
                      (tsdn,(hpa_shard_t *)self,size,&local_61,sVar6,local_40,
                       deferred_work_generated);
    sVar7 = local_58 + sVar7;
  }
LAB_0119893e:
  *(undefined1 *)&self[4].expand = 0;
  pthread_mutex_unlock(local_38);
  return sVar7;
}

Assistant:

static size_t
hpa_alloc_batch(tsdn_t *tsdn, pai_t *self, size_t size, size_t nallocs,
    edata_list_active_t *results, bool frequent_reuse,
    bool *deferred_work_generated) {
	assert(nallocs > 0);
	assert((size & PAGE_MASK) == 0);
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);
	hpa_shard_t *shard = hpa_from_pai(self);

	/*
	 * frequent_use here indicates this request comes from the arena bins,
	 * in which case it will be split into slabs, and therefore there is no
	 * intrinsic slack in the allocation (the entire range of allocated size
	 * will be accessed).
	 *
	 * In this case bypass the slab_max_alloc limit (if still within the
	 * huge page size).  These requests do not concern internal
	 * fragmentation with huge pages (again, the full size will be used).
	 */
	if (!(frequent_reuse && size <= HUGEPAGE) &&
	    (size > shard->opts.slab_max_alloc)) {
		return 0;
	}

	size_t nsuccess = hpa_alloc_batch_psset(tsdn, shard, size, nallocs,
	    results, deferred_work_generated);

	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	/*
	 * Guard the sanity checks with config_debug because the loop cannot be
	 * proven non-circular by the compiler, even if everything within the
	 * loop is optimized away.
	 */
	if (config_debug) {
		edata_t *edata;
		ql_foreach(edata, &results->head, ql_link_active) {
			emap_assert_mapped(tsdn, shard->emap, edata);
			assert(edata_pai_get(edata) == EXTENT_PAI_HPA);
			assert(edata_state_get(edata) == extent_state_active);
			assert(edata_arena_ind_get(edata) == shard->ind);
			assert(edata_szind_get_maybe_invalid(edata) ==
			    SC_NSIZES);
			assert(!edata_slab_get(edata));
			assert(edata_committed_get(edata));
			assert(edata_base_get(edata) == edata_addr_get(edata));
			assert(edata_base_get(edata) != NULL);
		}
	}
	return nsuccess;
}